

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O3

bool __thiscall
double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder,DtoaMode mode)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  int local_44;
  bool local_3d;
  int local_3c;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined2 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    local_3c = -0x55555556;
    local_3d = true;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = 0xaaaa;
    local_44 = -0x55555556;
    DoubleToAscii(value,mode,0,(char *)&local_38,0x12,&local_3d,&local_44,&local_3c);
    if ((local_3d == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
      iVar2 = *(int *)(result_builder + 0x10);
      *(int *)(result_builder + 0x10) = iVar2 + 1;
      *(undefined1 *)(*(long *)result_builder + (long)iVar2) = 0x2d;
    }
    if ((this->decimal_in_shortest_low_ < local_3c) && (local_3c <= this->decimal_in_shortest_high_)
       ) {
      iVar2 = 0;
      if (0 < local_44 - local_3c) {
        iVar2 = local_44 - local_3c;
      }
      CreateDecimalRepresentation(this,(char *)&local_38,local_44,local_3c,iVar2,result_builder);
    }
    else {
      CreateExponentialRepresentation(this,(char *)&local_38,local_44,local_3c + -1,result_builder);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    bVar1 = HandleSpecialValues(this,value,result_builder);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToShortestIeeeNumber(
    double value,
    StringBuilder* result_builder,
    DoubleToStringConverter::DtoaMode mode) const {
  DOUBLE_CONVERSION_ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE);
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  int decimal_point;
  bool sign;
  const int kDecimalRepCapacity = kBase10MaximalLength + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, mode, 0, decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = (flags_ & UNIQUE_ZERO) != 0;
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  if ((decimal_in_shortest_low_ <= exponent) &&
      (exponent < decimal_in_shortest_high_)) {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length,
                                decimal_point,
                                (std::max)(0, decimal_rep_length - decimal_point),
                                result_builder);
  } else {
    CreateExponentialRepresentation(decimal_rep, decimal_rep_length, exponent,
                                    result_builder);
  }
  return true;
}